

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::slotGenerateBoard(Fifteen *this)

{
  bool bVar1;
  pointer pPVar2;
  pointer this_00;
  QString *pQVar3;
  QFlags<QMessageBox::StandardButton> local_48 [4];
  QString local_38;
  Result local_1c;
  BoardMode local_18;
  Result result;
  BoardMode boardMode;
  BoardSize boardSize;
  Fifteen *this_local;
  
  _boardMode = this;
  pPVar2 = std::unique_ptr<Panel,_std::default_delete<Panel>_>::operator->(&this->panel);
  result = Panel::checkBoardSize(pPVar2);
  pPVar2 = std::unique_ptr<Panel,_std::default_delete<Panel>_>::operator->(&this->panel);
  bVar1 = Panel::checkBoardMode(pPVar2,GRAPHIC);
  local_18 = (BoardMode)bVar1;
  this_00 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                      (&this->controller);
  local_1c = Controller::generateBoard(this_00,result,local_18);
  if (local_1c == OK) {
    redrawTiles(this);
  }
  else {
    QString::QString(&local_38,"");
    pQVar3 = Message::getMessage(local_1c);
    QFlags<QMessageBox::StandardButton>::QFlags(local_48,FirstButton);
    QMessageBox::information
              ((QWidget *)this,(QString *)&local_38,(QString *)pQVar3,
               (QFlags_conflict *)(ulong)(uint)local_48[0].i,NoButton);
    QString::~QString(&local_38);
  }
  return;
}

Assistant:

void Fifteen::slotGenerateBoard()
{
    BoardSize boardSize = panel->checkBoardSize();
    BoardMode boardMode = panel->checkBoardMode( BoardMode::GRAPHIC ) ? BoardMode::GRAPHIC : BoardMode::NUMERIC;

    if ( Result result = controller->generateBoard( boardSize, boardMode ); result != Result::OK )
    {
        QMessageBox::information( this, "", Message::getMessage( result ));
        return;
    }
    redrawTiles();
}